

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O3

int32_t read_varint32(uint8_t **cursor,uint8_t *end)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0;
  uVar3 = 0;
  do {
    bVar1 = read_byte(cursor,end);
    uVar3 = uVar3 | (uint)(bVar1 & 0x7f) << ((byte)uVar4 & 0x1f);
    uVar4 = uVar4 + 7;
  } while ((char)bVar1 < '\0');
  uVar2 = -1 << ((byte)uVar4 & 0x1f);
  if (bVar1 < 0x40) {
    uVar2 = 0;
  }
  if (0x1f < uVar4) {
    uVar2 = 0;
  }
  return uVar3 | uVar2;
}

Assistant:

int32_t read_varint32 (uint8_t** cursor, const uint8_t* end)
{
    int32_t result = 0;
    uint32_t shift = 0;
    uint32_t size = 32;
    uint32_t byte = 0;
    do
    {
        byte = read_byte (cursor, end);
        result |= (byte & 0x7F) << shift;
        shift += 7;
    } while (byte & 0x80);

    // sign bit of byte is second high order bit (0x40)
    if ((shift < size) && (byte & 0x40))
        result |= (~0 << shift); // sign extend

    return result;
}